

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O2

ssize_t __thiscall
LASreadItemCompressed_BYTE_v2::read
          (LASreadItemCompressed_BYTE_v2 *this,int __fd,void *__buf,size_t __nbytes)

{
  U8 UVar1;
  U32 UVar2;
  void *pvVar3;
  undefined4 in_register_00000034;
  U32 i;
  ulong uVar4;
  
  uVar4 = 0;
  while( true ) {
    if (this->number <= uVar4) break;
    UVar1 = this->last_item[uVar4];
    UVar2 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_byte[uVar4]);
    *(U8 *)((long)CONCAT44(in_register_00000034,__fd) + uVar4) = (char)UVar2 + UVar1;
    uVar4 = uVar4 + 1;
  }
  pvVar3 = memcpy(this->last_item,(void *)CONCAT44(in_register_00000034,__fd),(ulong)this->number);
  return (ssize_t)pvVar3;
}

Assistant:

inline void LASreadItemCompressed_BYTE_v2::read(U8* item, U32& context)
{
  U32 i;
  I32 value;
  for (i = 0; i < number; i++)
  {
    value = last_item[i] + dec->decodeSymbol(m_byte[i]);
    item[i] = U8_FOLD(value);
  }
  memcpy(last_item, item, number);
}